

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-loader.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  yaml_node_t *pyVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  yaml_document_t document;
  yaml_parser_t parser;
  yaml_document_t local_278;
  yaml_parser_t local_210;
  
  if (argc < 2) {
    printf("Usage: %s file1.yaml ...\n",*argv);
  }
  else {
    uVar5 = 1;
    do {
      printf("[%d] Loading \'%s\': ",uVar5 & 0xffffffff,argv[uVar5]);
      fflush(_stdout);
      __stream = fopen(argv[uVar5],"rb");
      if (__stream == (FILE *)0x0) {
        __assert_fail("file",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x22,"int main(int, char **)");
      }
      iVar1 = yaml_parser_initialize(&local_210);
      if (iVar1 == 0) {
        __assert_fail("yaml_parser_initialize(&parser)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x24,"int main(int, char **)");
      }
      yaml_parser_set_input_file(&local_210,(FILE *)__stream);
      iVar1 = -1;
      do {
        iVar6 = iVar1;
        iVar2 = yaml_parser_load(&local_210,&local_278);
        if (iVar2 == 0) break;
        pyVar3 = yaml_document_get_root_node(&local_278);
        yaml_document_delete(&local_278);
        iVar1 = iVar6 + 1;
      } while (pyVar3 != (yaml_node_t *)0x0);
      yaml_parser_delete(&local_210);
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        __assert_fail("!fclose(file)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x38,"int main(int, char **)");
      }
      pcVar4 = "SUCCESS";
      if (iVar2 == 0) {
        pcVar4 = "FAILURE";
      }
      printf("%s (%d documents)\n",pcVar4,(ulong)(iVar6 + 1));
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)argc);
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    int number;

    if (argc < 2) {
        printf("Usage: %s file1.yaml ...\n", argv[0]);
        return 0;
    }

    for (number = 1; number < argc; number ++)
    {
        FILE *file;
        yaml_parser_t parser;
        yaml_document_t document;
        int done = 0;
        int count = 0;
        int error = 0;

        printf("[%d] Loading '%s': ", number, argv[number]);
        fflush(stdout);

        file = fopen(argv[number], "rb");
        assert(file);

        assert(yaml_parser_initialize(&parser));

        yaml_parser_set_input_file(&parser, file);

        while (!done)
        {
            if (!yaml_parser_load(&parser, &document)) {
                error = 1;
                break;
            }

            done = (!yaml_document_get_root_node(&document));

            yaml_document_delete(&document);

            if (!done) count ++;
        }

        yaml_parser_delete(&parser);

        assert(!fclose(file));

        printf("%s (%d documents)\n", (error ? "FAILURE" : "SUCCESS"), count);
    }

    return 0;
}